

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::writeMessage(capnp *this,OutputStream *output,
                   ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  undefined1 *elementCount;
  _func_int **pp_Var1;
  Fault *pFVar2;
  OutputStream *pOVar3;
  undefined8 *puVar4;
  uint uVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  ArrayPtr<const_capnp::word> *pAVar7;
  ArrayPtr<const_unsigned_char> *ptrCopy;
  undefined8 *puVar8;
  ulong elementCount_00;
  Array<kj::ArrayPtr<const_unsigned_char>_> pieces_heap;
  Array<capnp::_::DirectWireValue<unsigned_int>_> table_heap;
  ArrayPtr<const_unsigned_char> pieces_stack [4];
  WireValue<uint32_t>_conflict table_stack [16];
  undefined1 *local_120;
  undefined8 *local_118;
  ulong local_110;
  undefined8 *local_108;
  Fault *local_100;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Fault local_78 [9];
  
  pAVar6 = segments.ptr;
  if (pAVar6 != (ArrayPtr<const_capnp::word> *)0x0) {
    elementCount_00 = ((ulong)pAVar6 & 0xfffffffffffffffe) + 2;
    if (elementCount_00 < 0x11) {
      pFVar2 = local_78;
      local_108 = (undefined8 *)0x0;
      local_110 = 0;
      local_100 = (Fault *)0x0;
    }
    else {
      pFVar2 = (Fault *)kj::_::HeapArrayDisposer::allocateImpl
                                  (4,elementCount_00,elementCount_00,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
      local_108 = &kj::_::HeapArrayDisposer::instance;
      local_110 = elementCount_00;
      local_100 = pFVar2;
    }
    *(int *)&pFVar2->exception = (int)segments.ptr + -1;
    pOVar3 = output + 1;
    uVar5 = 1;
    do {
      pAVar7 = (ArrayPtr<const_capnp::word> *)(ulong)uVar5;
      *(undefined4 *)((long)&pFVar2->exception + (long)pAVar7 * 4) =
           *(undefined4 *)&pOVar3->_vptr_OutputStream;
      pOVar3 = pOVar3 + 2;
      uVar5 = uVar5 + 1;
    } while (pAVar7 < pAVar6);
    if (((undefined1  [16])segments & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      *(undefined4 *)((long)&pFVar2->exception + (long)&pAVar6->ptr * 4 + 4) = 0;
    }
    elementCount = (undefined1 *)((long)&pAVar6->ptr + 1);
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    if (pAVar6 < (ArrayPtr<const_capnp::word> *)0x4) {
      puVar4 = &local_b8;
      local_118 = (undefined8 *)0x0;
      local_120 = (undefined1 *)0x0;
      puVar8 = (undefined8 *)0x0;
    }
    else {
      puVar4 = (undefined8 *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x10,(size_t)elementCount,(size_t)elementCount,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_unsigned_char>,_false,_false>::construct,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_unsigned_char>,_false,_false>::destruct);
      local_118 = &kj::_::HeapArrayDisposer::instance;
      puVar8 = puVar4;
      local_120 = elementCount;
    }
    *puVar4 = pFVar2;
    puVar4[1] = elementCount_00 * 4;
    pOVar3 = output + 1;
    uVar5 = 1;
    do {
      pp_Var1 = pOVar3->_vptr_OutputStream;
      pAVar7 = (ArrayPtr<const_capnp::word> *)(ulong)uVar5;
      puVar4[(long)pAVar7 * 2] = pOVar3[-1]._vptr_OutputStream;
      puVar4[(long)pAVar7 * 2 + 1] = (long)pp_Var1 << 3;
      pOVar3 = pOVar3 + 2;
      uVar5 = uVar5 + 1;
    } while (pAVar7 < pAVar6);
    (**(code **)(*(long *)this + 0x18))(this,puVar4,elementCount);
    if (puVar8 != (undefined8 *)0x0) {
      (**(code **)*local_118)(local_118,puVar8,0x10,local_120,local_120,0);
    }
    if (local_100 != (Fault *)0x0) {
      (**(code **)*local_108)(local_108,local_100,4,local_110,local_110,0);
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x11a,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(local_78);
}

Assistant:

void writeMessage(kj::OutputStream& output, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  KJ_STACK_ARRAY(_::WireValue<uint32_t>, table, (segments.size() + 2) & ~size_t(1), 16, 64);

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);
  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }
  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  KJ_STACK_ARRAY(kj::ArrayPtr<const byte>, pieces, segments.size() + 1, 4, 32);
  pieces[0] = table.asBytes();

  for (uint i = 0; i < segments.size(); i++) {
    pieces[i + 1] = segments[i].asBytes();
  }

  output.write(pieces);
}